

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat2Expanded
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  ostringstream *this_00;
  Hex<16UL> hex;
  bool bVar1;
  Hex<16UL> hex_00;
  long lVar2;
  Hex<16UL> hex_01;
  long lVar3;
  Hex<16UL> hex_02;
  StateQueryMemoryWriteGuard<long[2]> floatVector2;
  MessageBuilder local_1b0;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::StateQueryMemoryWriteGuard
            (&floatVector2);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,floatVector2.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::verifyValidity
                    (&floatVector2,testCtx);
  if (bVar1) {
    lVar2 = (long)((reference0 * 4.2949673e+09 + -1.0) * 0.5);
    hex.value = lVar2 - 0x7ff;
    lVar3 = (long)((reference1 * 4.2949673e+09 + -1.0) * 0.5);
    hex_00.value = lVar3 - 0x7ff;
    hex_01.value = lVar2 + 0x7ff;
    hex_02.value = lVar3 + 0x7ff;
    if (((long)hex_01.value < floatVector2.m_value[0] || floatVector2.m_value[0] < (long)hex.value)
       || (floatVector2.m_value[1] < (long)hex_00.value ||
           (long)hex_02.value < floatVector2.m_value[1])) {
      local_1b0.m_log = testCtx->m_log;
      this_00 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"// ERROR: expected in ranges ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,hex);
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,hex_01);
      std::operator<<((ostream *)this_00,"], ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,hex_00);
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,hex_02);
      std::operator<<((ostream *)this_00,"]");
      std::operator<<((ostream *)this_00,"; got ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<16UL>)floatVector2.m_value[0]);
      std::operator<<((ostream *)this_00,", ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<16UL>)floatVector2.m_value[1]);
      std::operator<<((ostream *)this_00," ");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat2Expanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1)
{
	DE_ASSERT(de::inRange(reference0, -1.0f, 1.0f));
	DE_ASSERT(de::inRange(reference1, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 referenceAsGLintMin[] =
	{
		expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E_64
	};
	const GLint64 referenceAsGLintMax[] =
	{
		expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E_64
	};

	StateQueryMemoryWriteGuard<GLint64[2]> floatVector2;
	glGetInteger64v(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] < referenceAsGLintMin[0] || floatVector2[0] > referenceAsGLintMax[0] ||
		floatVector2[1] < referenceAsGLintMin[1] || floatVector2[1] > referenceAsGLintMax[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "]"
			<< "; got "
			<< toHex(floatVector2[0]) << ", "
			<< toHex(floatVector2[1]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}